

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

ssize_t __thiscall
chatter::Protocol::send(Protocol *this,int __fd,void *__buf,size_t __n,int __flags)

{
  SeqNum SVar1;
  Host *this_00;
  ProtocolChannel *pPVar2;
  bool bVar3;
  byte bVar4;
  uint16_t uVar5;
  undefined7 extraout_var;
  element_type *peVar7;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  __shared_ptr *this_01;
  shared_ptr<chatter::Packet> local_40;
  list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
  *local_30;
  ProtocolChannel *chan;
  Peer *peer;
  __shared_ptr *p_Stack_18;
  bool immediate_local;
  ptr *packet_local;
  Protocol *this_local;
  ssize_t sVar6;
  
  this_01 = (__shared_ptr *)CONCAT44(in_register_00000034,__fd);
  peer._7_1_ = (byte)__buf & 1;
  p_Stack_18 = this_01;
  packet_local = (ptr *)this;
  bVar3 = std::__shared_ptr::operator_cast_to_bool(this_01);
  sVar6 = CONCAT71(extraout_var,bVar3);
  if (bVar3) {
    peVar7 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
    chan = (ProtocolChannel *)peVar7->m_peer;
    peVar7 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
    bVar3 = Packet::has_flag(peVar7,RELIABLE);
    pPVar2 = chan;
    if (bVar3) {
      peVar7 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_01);
      bVar4 = Packet::get_channel(peVar7);
      local_30 = &pPVar2[(ulong)bVar4 + 2].sent_reliable;
      SVar1 = *(SeqNum *)
               ((long)&(local_30->
                       super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                       )._M_impl._M_node.super__List_node_base._M_next + 4);
      *(SeqNum *)
       ((long)&(local_30->
               super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
               )._M_impl._M_node.super__List_node_base._M_next + 4) = SVar1 + 1;
      peVar7 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_01);
      peVar7->m_sequence_num = SVar1;
      std::__cxx11::
      list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>::
      push_back((list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                 *)&(local_30->
                    super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                    )._M_impl._M_node.super__List_node_base._M_prev,(value_type *)this_01);
    }
    uVar5 = Peer::get_rto((Peer *)chan);
    uVar5 = limit_rto(this,uVar5);
    peVar7 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
    peVar7->m_rto = uVar5;
    peVar7 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
    peVar7->m_send_queued = true;
    this_00 = this->m_host;
    std::shared_ptr<chatter::Packet>::shared_ptr(&local_40,(shared_ptr<chatter::Packet> *)this_01);
    Host::queue_outgoing_packet(this_00,&local_40,(bool)(peer._7_1_ & 1));
    std::shared_ptr<chatter::Packet>::~shared_ptr(&local_40);
    sVar6 = extraout_RAX;
  }
  return sVar6;
}

Assistant:

void Protocol::send(Packet::ptr packet, bool immediate /* = false */)
{
    if (!packet)
        return;

    Peer* peer = packet->m_peer;

    if (packet->has_flag(PacketFlag::RELIABLE)) {
        /* Assign a sequence number for this packet and track it.*/
        ProtocolChannel& chan = peer->m_channels[packet->get_channel()];
        packet->m_sequence_num = chan.next_sequence++;
        chan.sent_reliable.push_back(packet);
    }

    packet->m_rto = limit_rto(peer->get_rto());
    packet->m_send_queued = true;

    m_host->queue_outgoing_packet(packet, immediate);
}